

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O1

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,
          shared_ptr<mocker::ir::Reg> *args_1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mocker::ir::IRInst> local_28;
  
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f1518;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  peVar1 = (args->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (args->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (args->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (args->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (args_1->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (args_1->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (args_1->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (args_1->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 7;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Store_001f1568;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
    ._M_use_count = p_Var2;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]
    ._M_use_count = p_Var4;
  appendInst(this,&local_28);
  if (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }